

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void likeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3 *psVar1;
  compareInfo *pInfo;
  Mem *pMem;
  int iVar2;
  u32 matchOther;
  byte *pbVar3;
  u8 *zPattern;
  u8 *zString;
  byte bVar4;
  int iVar5;
  uchar *zEsc;
  byte *local_30;
  
  psVar1 = context->pOut->db;
  pInfo = (compareInfo *)context->pFunc->pUserData;
  iVar2 = sqlite3ValueBytes(*argv,'\x01');
  if (psVar1->aLimit[8] < iVar2) {
    context->isError = 1;
    sqlite3VdbeMemSetStr
              (context->pOut,"LIKE or GLOB pattern too complex",-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
    return;
  }
  if (argc == 3) {
    local_30 = (byte *)sqlite3ValueText(argv[2],'\x01');
    if (local_30 == (byte *)0x0) {
      return;
    }
    bVar4 = *local_30;
    if (local_30 != (byte *)0xffffffffffffffff && bVar4 != 0) {
      pbVar3 = local_30;
      iVar2 = 0;
      do {
        iVar5 = iVar2;
        if (bVar4 < 0xc0) {
          bVar4 = pbVar3[1];
        }
        else {
          bVar4 = pbVar3[1];
        }
        pbVar3 = pbVar3 + 1;
      } while ((bVar4 != 0) && (iVar2 = iVar5 + 1, pbVar3 != (byte *)0xffffffffffffffff));
      if (iVar5 == 0) {
        matchOther = sqlite3Utf8Read(&local_30);
        goto LAB_001ba7b3;
      }
    }
    context->isError = 1;
    sqlite3VdbeMemSetStr
              (context->pOut,"ESCAPE expression must be a single character",-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
  }
  else {
    matchOther = (u32)pInfo->matchSet;
LAB_001ba7b3:
    zPattern = (u8 *)sqlite3ValueText(*argv,'\x01');
    zString = (u8 *)sqlite3ValueText(argv[1],'\x01');
    if (zPattern != (u8 *)0x0 && zString != (u8 *)0x0) {
      iVar2 = patternCompare(zPattern,zString,pInfo,matchOther);
      pMem = context->pOut;
      if ((pMem->flags & 0x2400) != 0) {
        vdbeReleaseAndSetInt64(pMem,(ulong)(iVar2 == 0));
        return;
      }
      (pMem->u).i = (ulong)(iVar2 == 0);
      pMem->flags = 4;
    }
  }
  return;
}

Assistant:

static void likeFunc(
  sqlite3_context *context, 
  int argc, 
  sqlite3_value **argv
){
  const unsigned char *zA, *zB;
  u32 escape;
  int nPat;
  sqlite3 *db = sqlite3_context_db_handle(context);
  struct compareInfo *pInfo = sqlite3_user_data(context);

#ifdef SQLITE_LIKE_DOESNT_MATCH_BLOBS
  if( sqlite3_value_type(argv[0])==SQLITE_BLOB
   || sqlite3_value_type(argv[1])==SQLITE_BLOB
  ){
#ifdef SQLITE_TEST
    sqlite3_like_count++;
#endif
    sqlite3_result_int(context, 0);
    return;
  }
#endif

  /* Limit the length of the LIKE or GLOB pattern to avoid problems
  ** of deep recursion and N*N behavior in patternCompare().
  */
  nPat = sqlite3_value_bytes(argv[0]);
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] );
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH]+1 );
  if( nPat > db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] ){
    sqlite3_result_error(context, "LIKE or GLOB pattern too complex", -1);
    return;
  }
  if( argc==3 ){
    /* The escape character string must consist of a single UTF-8 character.
    ** Otherwise, return an error.
    */
    const unsigned char *zEsc = sqlite3_value_text(argv[2]);
    if( zEsc==0 ) return;
    if( sqlite3Utf8CharLen((char*)zEsc, -1)!=1 ){
      sqlite3_result_error(context, 
          "ESCAPE expression must be a single character", -1);
      return;
    }
    escape = sqlite3Utf8Read(&zEsc);
  }else{
    escape = pInfo->matchSet;
  }
  zB = sqlite3_value_text(argv[0]);
  zA = sqlite3_value_text(argv[1]);
  if( zA && zB ){
#ifdef SQLITE_TEST
    sqlite3_like_count++;
#endif
    sqlite3_result_int(context,
                      patternCompare(zB, zA, pInfo, escape)==SQLITE_MATCH);
  }
}